

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_merge_to_ctx(lyd_node **trg,lyd_node *src,int options,ly_ctx *ctx)

{
  lyd_node **pplVar1;
  ly_ctx *plVar2;
  bool bVar3;
  int iVar4;
  uint dflt;
  LY_ERR *pLVar5;
  lys_node *plVar6;
  lyd_node *plVar7;
  lys_node *plVar8;
  lyd_node *plVar9;
  char *pcVar10;
  lyd_node *plVar11;
  lyd_node *plVar12;
  char *format;
  int iVar13;
  int iVar14;
  lys_node *local_88;
  lyd_node *local_78;
  lyd_node *local_68;
  lyd_node *local_48;
  ly_ctx *local_40;
  
  pLVar5 = ly_errno_location();
  *pLVar5 = LY_SUCCESS;
  if ((trg == (lyd_node **)0x0) ||
     (plVar7 = *trg, src == (lyd_node *)0x0 || plVar7 == (lyd_node *)0x0)) {
    pLVar5 = ly_errno_location();
    *pLVar5 = LY_EINVAL;
    return -1;
  }
  plVar6 = plVar7->schema;
  while (plVar6 = lys_parent(plVar6), plVar6 != (lys_node *)0x0) {
    if (plVar6->nodetype != LYS_USES) {
      pLVar5 = ly_errno_location();
      *pLVar5 = LY_EINVAL;
      ly_log(LY_LLERR,"Target not a top-level data tree.");
      return -1;
    }
  }
  if ((ctx == (ly_ctx *)0x0) || (plVar7->schema->module->ctx == ctx)) {
    plVar2 = src->schema->module->ctx;
    local_40 = plVar7->schema->module->ctx;
    if ((plVar2 == local_40) && (local_40 = ctx, plVar2 == ctx)) {
      local_40 = (ly_ctx *)0x0;
    }
  }
  else {
    do {
      local_48 = plVar7;
      plVar7 = local_48->prev;
    } while (local_48->prev->next != (lyd_node *)0x0);
    *trg = local_48;
    local_40 = ctx;
    if (local_48 == (lyd_node *)0x0) {
      local_48 = (lyd_node *)0x0;
      plVar7 = local_48;
    }
    else {
      plVar9 = (lyd_node *)0x0;
      do {
        plVar7 = lyd_dup_to_ctx(local_48,1,ctx);
        if ((plVar7 == (lyd_node *)0x0) ||
           ((plVar9 != (lyd_node *)0x0 &&
            (iVar4 = lyd_insert_after(plVar9->prev,plVar7), plVar7 = plVar9, iVar4 != 0)))) {
          plVar7 = (lyd_node *)0x0;
          goto LAB_0015f0ff;
        }
        local_48 = local_48->next;
        plVar9 = plVar7;
      } while (local_48 != (lyd_node *)0x0);
    }
  }
  local_48 = plVar7;
  plVar6 = src->schema;
  plVar8 = lys_parent(plVar6);
  iVar4 = 0;
  while (plVar8 != (lys_node *)0x0) {
    plVar6 = lys_parent(plVar6);
    iVar4 = iVar4 + 1;
    plVar8 = lys_parent(plVar6);
  }
  bVar3 = true;
  dflt = 1;
  if (iVar4 != 0) {
    plVar7 = src;
    if (((uint)options >> 0xc & 1) == 0) {
      do {
        if ((plVar7->field_0x9 & 1) == 0) {
          dflt = 0;
          goto LAB_0015ee3e;
        }
        pplVar1 = &plVar7->next;
        plVar7 = *pplVar1;
      } while (*pplVar1 != (lyd_node *)0x0);
      dflt = 1;
    }
    else {
      dflt = (byte)src->field_0x9 & 1;
    }
  }
LAB_0015ee3e:
  local_78 = (lyd_node *)0x0;
  local_68 = local_48;
  local_88 = (lys_node *)0x0;
  iVar14 = 0;
  plVar9 = (lyd_node *)0x0;
  do {
    do {
      plVar7 = plVar9;
      plVar6 = src->schema;
      if (iVar14 < iVar4) {
        iVar13 = 0;
        do {
          plVar6 = lys_parent(plVar6);
          iVar13 = iVar13 + 1;
        } while (iVar13 < iVar4 - iVar14);
      }
      if (plVar6 == src->schema) {
LAB_0015efc2:
        if (((uint)options >> 10 & 1) != 0) {
          plVar9 = src->prev;
          if (((uint)options >> 0xc & 1) != 0 && plVar9 != src) {
            lyd_unlink_internal(src,1);
            lyd_free_withsiblings(plVar9);
          }
          goto LAB_0015f052;
        }
        plVar12 = (lyd_node *)0x0;
        plVar9 = src;
        goto LAB_0015efd7;
      }
      iVar14 = iVar14 + 1;
      plVar9 = plVar7;
    } while ((plVar6->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN);
    if (plVar6 == src->schema) goto LAB_0015efc2;
    if (plVar6->nodetype != LYS_CONTAINER) {
      pLVar5 = ly_errno_location();
      *pLVar5 = LY_EINVAL;
      pcVar10 = strnodetype(plVar6->nodetype);
      format = "Cannot create %s \"%s\" for the merge.";
LAB_0015f18f:
      ly_log(LY_LLERR,format,pcVar10);
      break;
    }
    if (plVar7 == (lyd_node *)0x0) {
      local_78 = local_68;
      if (!bVar3) {
        local_78 = local_68->child;
      }
      for (; plVar12 = local_68, local_78 != (lyd_node *)0x0; local_78 = local_78->next) {
        local_88 = plVar6;
        if ((local_40 != (ly_ctx *)0x0) &&
           (local_88 = lys_get_schema_inctx(plVar6,local_40), local_88 == (lys_node *)0x0)) {
          pLVar5 = ly_errno_location();
          *pLVar5 = LY_EINVAL;
          plVar7 = (lyd_node *)0x0;
          ly_log(LY_LLERR,
                 "Target context does not contain schema node for the data node being merged (%s:%s)."
                 ,plVar6->module->name,plVar6->name);
          goto LAB_0015f0ff;
        }
        plVar12 = local_78;
        if (local_78->schema == local_88) break;
      }
      local_68 = plVar12;
      if (((uint)options >> 10 & 1) == 0) {
        plVar6 = local_88;
      }
      bVar3 = false;
    }
    else if ((((uint)options >> 10 & 1) == 0 && local_40 != (ly_ctx *)0x0) &&
            (plVar6 = lys_get_schema_inctx(plVar6,local_40), plVar6 == (lys_node *)0x0)) {
      pLVar5 = ly_errno_location();
      *pLVar5 = LY_EINVAL;
      pcVar10 = *(char **)(_DAT_00000030 + 8);
      format = "Target context does not contain schema node for the data node being merged (%s:%s)."
      ;
      goto LAB_0015f18f;
    }
  } while (((local_78 != (lyd_node *)0x0) ||
           (plVar9 = _lyd_new((lyd_node *)0x0,plVar6,dflt), plVar7 == (lyd_node *)0x0)) ||
          (iVar13 = lyd_insert(plVar9,plVar7), iVar13 == 0));
  goto LAB_0015f0ff;
  while ((((uint)options >> 0xc & 1) == 0 &&
         (plVar9 = plVar9->next, plVar12 = src, plVar9 != (lyd_node *)0x0))) {
LAB_0015efd7:
    src = lyd_dup_to_ctx(plVar9,1,local_40);
    if ((src == (lyd_node *)0x0) ||
       ((plVar12 != (lyd_node *)0x0 &&
        (iVar4 = lyd_insert_after(plVar12->prev,src), src = plVar12, iVar4 != 0)))) {
      lyd_free_withsiblings(plVar12);
      goto LAB_0015f0ff;
    }
  }
LAB_0015f052:
  plVar9 = plVar7;
  plVar12 = src;
  if (plVar7 != (lyd_node *)0x0) {
    do {
      plVar11 = plVar9;
      plVar9 = plVar11->child;
    } while (plVar11->child != (lyd_node *)0x0);
    plVar11->child = src;
    do {
      src->parent = plVar11;
      src = src->next;
      plVar12 = plVar7;
    } while (src != (lyd_node *)0x0);
  }
  plVar7 = plVar12;
  if (bVar3) {
    iVar4 = lyd_merge_siblings(local_68,plVar7,options);
  }
  else {
    iVar4 = lyd_merge_parent_children(local_68,plVar7,options);
  }
  if (iVar4 == 0) {
    if (local_48->schema->nodetype == LYS_RPC) {
      lyd_schema_sort(local_48,1);
    }
    if (*trg != local_48) {
      lyd_free_withsiblings(*trg);
      *trg = local_48;
      return 0;
    }
    return 0;
  }
LAB_0015f0ff:
  if (*trg != local_48) {
    lyd_free_withsiblings(local_48);
  }
  lyd_free_withsiblings(plVar7);
  return -1;
}

Assistant:

API int
lyd_merge_to_ctx(struct lyd_node **trg, const struct lyd_node *src, int options, struct ly_ctx *ctx)
{
    struct lyd_node *node = NULL, *node2, *target, *trg_merge_start, *src_merge_start = NULL;
    const struct lyd_node *iter;
    struct lys_node *src_snode, *sch = NULL;
    int i, src_depth, depth, first_iter, ret, dflt = 1;
    const struct lys_node *parent = NULL;

    /* initialize errno */
    ly_errno = LY_SUCCESS;

    if (!trg || !(*trg) || !src) {
        ly_errno = LY_EINVAL;
        return -1;
    }
    target = *trg;

    parent = lys_parent(target->schema);

    /* go up all uses */
    while (parent && (parent->nodetype == LYS_USES)) {
        parent = lys_parent(parent);
    }

    if (parent) {
        LOGERR(LY_EINVAL, "Target not a top-level data tree.");
        return -1;
    }

    /* get know if we are converting data into a different context */
    if (ctx && target->schema->module->ctx != ctx) {
        /* target's data tree context differs from the target context, move the target
         * data tree into the target context */

        /* get the first target's top-level and store it as the result */
        for (; target->prev->next; target = target->prev);
        *trg = target;

        for (node = NULL, trg_merge_start = target; target; target = target->next) {
            node2 = lyd_dup_to_ctx(target, 1, ctx);
            if (!node2) {
                goto error;
            }
            if (node) {
                if (lyd_insert_after(node->prev, node2)) {
                    goto error;
                }
            } else {
                node = node2;
            }
        }
        target = node;
        node = NULL;
    } else if (src->schema->module->ctx != target->schema->module->ctx) {
        /* the source data will be converted into the target's context during the merge */
        ctx = target->schema->module->ctx;
    } else if (ctx == src->schema->module->ctx) {
        /* no conversion is needed */
        ctx = NULL;
    }

    /* find source top-level schema node */
    for (src_snode = src->schema, src_depth = 0;
         lys_parent(src_snode);
         src_snode = lys_parent(src_snode), ++src_depth);

    /* find first shared missing schema parent of the subtrees */
    trg_merge_start = target;
    depth = 0;
    first_iter = 1;
    if (src_depth) {
        /* we are going to create missing parents in the following loop,
         * but we will need to know a dflt flag for them. In case the newly
         * created parent is going to have at least one non-default child,
         * it will be also non-default, otherwise it will be the default node */
        if (options & LYD_OPT_NOSIBLINGS) {
            dflt = src->dflt;
        } else {
            LY_TREE_FOR(src, iter) {
                if (!iter->dflt) {
                    /* non default sibling -> parent is going to be
                     * created also as non-default */
                    dflt = 0;
                    break;
                }
            }
        }
    }
    while (1) {
        /* going from down (source root) to up (top-level or the common node with target */
        do {
            for (src_snode = src->schema, i = 0; i < src_depth - depth; src_snode = lys_parent(src_snode), ++i);
            ++depth;
        } while (src_snode != src->schema && (src_snode->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES)));

        if (src_snode == src->schema) {
            break;
        }

        if (src_snode->nodetype != LYS_CONTAINER) {
            /* we would have to create a list (the only data node with children except container), impossible */
            LOGERR(LY_EINVAL, "Cannot create %s \"%s\" for the merge.", strnodetype(src_snode->nodetype), src_snode->name);
            goto error;
        }

        /* have we created any missing containers already? if we did,
         * it is totally useless to search for match, there won't ever be */
        if (!src_merge_start) {
            if (first_iter) {
                node = trg_merge_start;
                first_iter = 0;
            } else {
                node = trg_merge_start->child;
            }

            /* find it in target data nodes */
            LY_TREE_FOR(node, node) {
                if (ctx) {
                    /* we have the schema nodes in the different context */
                    sch = lys_get_schema_inctx(src_snode, ctx);
                    if (!sch) {
                        LOGERR(LY_EINVAL, "Target context does not contain schema node for the data node being "
                               "merged (%s:%s).", src_snode->module->name, src_snode->name);
                        goto error;
                    }
                } else {
                    /* the context is same and comparison of the schema nodes will works fine */
                    sch = src_snode;
                }

                if (node->schema == sch) {
                    trg_merge_start = node;
                    break;
                }
            }

            if (!(options & LYD_OPT_DESTRUCT)) {
                /* the source tree will be duplicated, so to save some work in case
                 * of different target context, create also the parents nodes in the
                 * correct context */
                src_snode = sch;
            }
        } else if (ctx && !(options & LYD_OPT_DESTRUCT)) {
            /* get the schema node in the correct (target) context, same as above,
             * this is done to save some work and have the source in the same context
             * when the provided source tree is below duplicated in the target context
             * and connected into the parents created here */
            src_snode = lys_get_schema_inctx(src_snode, ctx);
            if (!src_snode) {
                LOGERR(LY_EINVAL, "Target context does not contain schema node for the data node being "
                       "merged (%s:%s).", src_snode->module->name, src_snode->name);
                goto error;
            }
        }

        if (!node) {
            /* it is not there, create it */
            node2 = _lyd_new(NULL, src_snode, dflt);
            if (!src_merge_start) {
                src_merge_start = node2;
            } else {
                if (lyd_insert(node2, src_merge_start)) {
                    goto error;
                }
                src_merge_start = node2;
            }
        }
    }

    /* process source according to options */
    if (options & LYD_OPT_DESTRUCT) {
        node = (struct lyd_node *)src;
        if ((node->prev != node) && (options & LYD_OPT_NOSIBLINGS)) {
            node2 = node->prev;
            lyd_unlink(node);
            lyd_free_withsiblings(node2);
        }
    } else {
        node = NULL;
        for (; src; src = src->next) {
            /* because we already have to duplicate it, do it in the correct context */
            node2 = lyd_dup_to_ctx(src, 1, ctx);
            if (!node2) {
                lyd_free_withsiblings(node);
                goto error;
            }
            if (node) {
                if (lyd_insert_after(node->prev, node2)) {
                    lyd_free_withsiblings(node);
                    goto error;
                }
            } else {
                node = node2;
            }

            if (options & LYD_OPT_NOSIBLINGS) {
                break;
            }
        }
    }

    if (src_merge_start) {
        /* insert data into the created parents */
        /* first, get the lowest created parent, we don't have to check the nodetype since we are
         * creating only a simple chain of containers */
        for (node2 = src_merge_start; node2->child; node2 = node2->child);
        node2->child = node;
        LY_TREE_FOR(node, node) {
            node->parent = node2;
        }
    } else {
        src_merge_start = node;
    }

    if (!first_iter) {
        /* !! src_merge start is a child(ren) of trg_merge_start */
        ret = lyd_merge_parent_children(trg_merge_start, src_merge_start, options);
    } else {
        /* !! src_merge start is a (top-level) sibling(s) of trg_merge_start */
        ret = lyd_merge_siblings(trg_merge_start, src_merge_start, options);
    }
    if (ret) {
        goto error;
    }

    if (target->schema->nodetype == LYS_RPC) {
        lyd_schema_sort(target, 1);
    }

    /* update the pointer to the target tree if needed */
    if (*trg != target) {
        lyd_free_withsiblings(*trg);
        (*trg) = target;
    }
    return ret;

error:
    if (*trg != target) {
        /* target is duplication of the original target in different context,
         * free it due to the error */
        lyd_free_withsiblings(target);
    }
    lyd_free_withsiblings(src_merge_start);
    return -1;
}